

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O0

bool __thiscall Js::DynamicObject::DeoptimizeObjectHeaderInlining(DynamicObject *this)

{
  bool bVar1;
  uint16 newInlineSlotCapacity_00;
  int iVar2;
  DynamicTypeHandler *typeHandler;
  PathTypeHandlerBase *pPVar3;
  JavascriptLibrary *library;
  DynamicType *this_00;
  DynamicType *newType;
  PropertyIndex newInlineSlotCapacity;
  PathTypeHandlerBase *newTypeHandler;
  PathTypeHandlerBase *oldTypeHandler;
  DynamicObject *this_local;
  undefined4 extraout_var;
  
  bVar1 = IsObjectHeaderInlinedTypeHandler(this);
  if (bVar1) {
    bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,ObjectHeaderInliningPhase);
    if (bVar1) {
      Output::Print(L"ObjectHeaderInlining: De-optimizing the object.\n");
      Output::Flush();
    }
    typeHandler = GetTypeHandler(this);
    pPVar3 = PathTypeHandlerBase::FromTypeHandler(typeHandler);
    library = RecyclableObject::GetLibrary(&this->super_RecyclableObject);
    pPVar3 = PathTypeHandlerBase::DeoptimizeObjectHeaderInlining(pPVar3,library);
    newInlineSlotCapacity_00 =
         DynamicTypeHandler::GetInlineSlotCapacity(&pPVar3->super_DynamicTypeHandler);
    iVar2 = DynamicTypeHandler::GetSlotCapacity(&pPVar3->super_DynamicTypeHandler);
    DynamicTypeHandler::AdjustSlots
              (this,newInlineSlotCapacity_00,iVar2 - (uint)newInlineSlotCapacity_00);
    iVar2 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x67])();
    this_00 = (DynamicType *)CONCAT44(extraout_var,iVar2);
    Memory::WriteBarrierPtr<Js::DynamicTypeHandler>::operator=
              (&this_00->typeHandler,&pPVar3->super_DynamicTypeHandler);
    DynamicType::ShareType(this_00);
    Memory::WriteBarrierPtr<Js::Type>::operator=
              (&(this->super_RecyclableObject).type,(Type *)this_00);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DynamicObject::DeoptimizeObjectHeaderInlining()
    {
        if(!IsObjectHeaderInlinedTypeHandler())
        {
            return false;
        }

        if (PHASE_TRACE1(Js::ObjectHeaderInliningPhase))
        {
            Output::Print(_u("ObjectHeaderInlining: De-optimizing the object.\n"));
            Output::Flush();
        }

        PathTypeHandlerBase *const oldTypeHandler = PathTypeHandlerBase::FromTypeHandler(GetTypeHandler());
        PathTypeHandlerBase *const newTypeHandler = oldTypeHandler->DeoptimizeObjectHeaderInlining(GetLibrary());

        const PropertyIndex newInlineSlotCapacity = newTypeHandler->GetInlineSlotCapacity();
        DynamicTypeHandler::AdjustSlots(
            this,
            newInlineSlotCapacity,
            newTypeHandler->GetSlotCapacity() - newInlineSlotCapacity);

        DynamicType *const newType = DuplicateType();
        newType->typeHandler = newTypeHandler;
        newType->ShareType();
        type = newType;
        return true;
    }